

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O0

void __thiscall
test_matrix_sparse_scalar_matrix_multiplication_Test::
test_matrix_sparse_scalar_matrix_multiplication_Test
          (test_matrix_sparse_scalar_matrix_multiplication_Test *this)

{
  test_matrix_sparse_scalar_matrix_multiplication_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__test_matrix_sparse_scalar_matrix_multiplication_Test_001f5ca0;
  return;
}

Assistant:

TEST(test_matrix_sparse, scalar_matrix_multiplication) {
  Matrix_Sparse matrix({0, 1, 3, 3}, {1, 0, 2}, {3.0, -4.0, 5.0}, 3);
  Matrix_Sparse matrix_result = -10.0 * matrix;

  EXPECT_EQ(matrix_result.size_row(), 3);
  EXPECT_EQ(matrix_result.size_column(), 3);
  EXPECT_EQ(matrix_result.size_non_zero(), 3);
  EXPECT_DOUBLE_EQ(matrix_result[0][1], -30.0);
  EXPECT_DOUBLE_EQ(matrix_result[1][0], 40.0);
  EXPECT_DOUBLE_EQ(matrix_result[1][2], -50.0);
}